

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

int64_t duckdb::DatePart::EpochMillisOperator::Operation<duckdb::timestamp_t,long>
                  (timestamp_t input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  timestamp_ms_t result;
  timestamp_ms_t local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>(input,&local_40,false);
  if (bVar1) {
    return local_40.super_timestamp_t.value.value;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_ms_t>
            (&local_38,(duckdb *)input.value,(timestamp_t)auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,(string *)&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::EpochMillisOperator::Operation(timestamp_t input) {
	D_ASSERT(Timestamp::IsFinite(input));
	return Cast::Operation<timestamp_t, timestamp_ms_t>(input).value;
}